

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::equality::~equality(equality *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      TEST_EQ("#t", run("(equal? 'yes 'yes)"));
      TEST_EQ("#f", run("(equal? 'yes 'no)"));
      TEST_EQ("#t", run("(equal? (* 6 7) 42)"));
      TEST_EQ("#f", run("(equal? 2 2.0)"));
      TEST_EQ("#t", run("(let ([v (cons 1 2)]) (equal? v v))"));
      TEST_EQ("#t", run("(equal? (cons 1 2) (cons 1 2))"));
      TEST_EQ("#t", run("(equal? (cons (cons 3 4) 2) (cons (cons 3 4) 2))"));
      TEST_EQ("#t", run("(equal? (fixnum->char 955) (fixnum->char 955))"));
      TEST_EQ("#t", run("(equal? (make-string 3 #\\z) (make-string 3 #\\z))"));
      TEST_EQ("#t", run("(equal? #t #t)"));

      TEST_EQ("#t", run("(%eqv? 'yes 'yes)"));
      TEST_EQ("#f", run("(%eqv? 'yes 'no)"));
      TEST_EQ("#t", run("(%eqv? (* 6 7) 42)"));
      TEST_EQ("#f", run("(%eqv? 2 2.0)"));
      TEST_EQ("#t", run("(let ([v (cons 1 2)]) (%eqv? v v))"));
      TEST_EQ("#t", run("(%eqv? (cons 1 2) (cons 1 2))"));
      TEST_EQ("#f", run("(%eqv? (cons (cons 3 4) 2) (cons (cons 3 4) 2))"));
      TEST_EQ("#t", run("(%eqv? (fixnum->char 955) (fixnum->char 955))"));
      TEST_EQ("#t", run("(%eqv? (make-string 3 #\\z) (make-string 3 #\\z))"));
      TEST_EQ("#t", run("(%eqv? #t #t)"));

      TEST_EQ("#t", run("(eq? 'yes 'yes)"));
      TEST_EQ("#f", run("(eq? 'yes 'no)"));
      TEST_EQ("#t", run("(eq? (* 6 7) 42)"));
      TEST_EQ("#f", run("(eq? 2 2.0)"));
      TEST_EQ("#t", run("(let ([v (cons 1 2)]) (eq? v v))"));
      TEST_EQ("#f", run("(eq? (cons 1 2) (cons 1 2))"));
      TEST_EQ("#f", run("(eq? (cons (cons 3 4) 2) (cons (cons 3 4) 2))"));
      TEST_EQ("#t", run("(eq? (fixnum->char 955) (fixnum->char 955))"));
      TEST_EQ("#f", run("(eq? (make-string 3 #\\z) (make-string 3 #\\z))"));
      TEST_EQ("#t", run("(eq? #t #t)"));
      }